

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

int event_changelist_add_(event_base *base,int fd,short old,short events,void *p)

{
  event_change *peVar1;
  int iVar2;
  uint8_t uVar3;
  
  peVar1 = event_changelist_get_or_construct(&base->changelist,fd,old,(event_changelist_fdinfo *)p);
  if (peVar1 == (event_change *)0x0) {
    iVar2 = -1;
  }
  else {
    uVar3 = ((byte)events & 0x38) + 1;
    if ((events & 10U) != 0) {
      peVar1->read_change = uVar3;
    }
    if ((events & 4U) != 0) {
      peVar1->write_change = uVar3;
    }
    iVar2 = 0;
    if ((char)(byte)events < '\0') {
      peVar1->close_change = uVar3;
    }
  }
  return iVar2;
}

Assistant:

int
event_changelist_add_(struct event_base *base, evutil_socket_t fd, short old, short events,
    void *p)
{
	struct event_changelist *changelist = &base->changelist;
	struct event_changelist_fdinfo *fdinfo = p;
	struct event_change *change;
	ev_uint8_t evchange = EV_CHANGE_ADD | (events & (EV_ET|EV_PERSIST|EV_SIGNAL));

	event_changelist_check(base);

	change = event_changelist_get_or_construct(changelist, fd, old, fdinfo);
	if (!change)
		return -1;

	/* An add replaces any previous delete, but doesn't result in a no-op,
	 * since the delete might fail (because the fd had been closed since
	 * the last add, for instance. */

	if (events & (EV_READ|EV_SIGNAL))
		change->read_change = evchange;
	if (events & EV_WRITE)
		change->write_change = evchange;
	if (events & EV_CLOSED)
		change->close_change = evchange;

	event_changelist_check(base);
	return (0);
}